

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_w,float default_h)

{
  ImVec2 IVar1;
  ImVec2 local_30;
  ImVec2 region_max;
  ImGuiWindow *window;
  float default_h_local;
  float default_w_local;
  ImVec2 size_local;
  
  region_max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_30);
  default_h_local = size.x;
  default_w_local = size.y;
  if ((default_h_local < 0.0) || (default_w_local < 0.0)) {
    local_30 = GetContentRegionMaxAbs();
  }
  if ((default_h_local != 0.0) || (NAN(default_h_local))) {
    IVar1 = size;
    if (default_h_local < 0.0) {
      default_h_local =
           ImMax<float>(4.0,(local_30.x - *(float *)((long)region_max + 0x118)) + default_h_local);
      IVar1 = _default_h_local;
    }
  }
  else {
    default_h_local = default_w;
    IVar1 = _default_h_local;
  }
  _default_h_local = IVar1;
  if ((default_w_local != 0.0) || (NAN(default_w_local))) {
    if (default_w_local < 0.0) {
      default_w_local =
           ImMax<float>(4.0,(local_30.y - *(float *)((long)region_max + 0x11c)) + default_w_local);
    }
  }
  else {
    default_w_local = default_h;
  }
  return _default_h_local;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_w, float default_h)
{
    ImGuiWindow* window = GImGui->CurrentWindow;

    ImVec2 region_max;
    if (size.x < 0.0f || size.y < 0.0f)
        region_max = GetContentRegionMaxAbs();

    if (size.x == 0.0f)
        size.x = default_w;
    else if (size.x < 0.0f)
        size.x = ImMax(4.0f, region_max.x - window->DC.CursorPos.x + size.x);

    if (size.y == 0.0f)
        size.y = default_h;
    else if (size.y < 0.0f)
        size.y = ImMax(4.0f, region_max.y - window->DC.CursorPos.y + size.y);

    return size;
}